

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O1

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Parser,false>
          (IntResult *__return_storage_ptr__,NumberParser *this,Parser *stream)

{
  Token TVar1;
  bool bVar2;
  uint uVar3;
  SourceLocation SVar4;
  int iVar5;
  Token TVar6;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  Token first;
  Token local_a8;
  Token local_98;
  Token local_88;
  Token local_78;
  Token local_68;
  Token local_58;
  Token local_40;
  
  TVar6 = ParserBase::getLastConsumed(&stream->super_ParserBase);
  local_78._0_8_ = TVar6._0_8_;
  Token::Token(&local_88);
  Token::Token(&local_98);
  TVar6 = ParserBase::consume(&stream->super_ParserBase);
  if (TVar6.kind == IntegerBase) {
    local_98 = TVar6;
    Token::Token(&local_40);
    startVector(this,TVar6,local_40);
  }
  else {
    bVar2 = ParserBase::peek(&stream->super_ParserBase,IntegerBase);
    if (!bVar2) {
      checkIntOverflow(this,TVar6);
      Token::Token(&__return_storage_ptr__->size);
      Token::Token(&__return_storage_ptr__->base);
      __return_storage_ptr__->value = TVar6;
      __return_storage_ptr__->isSimple = true;
      return __return_storage_ptr__;
    }
    local_88 = TVar6;
    local_98 = ParserBase::consume(&stream->super_ParserBase);
    startVector(this,local_98,local_88);
  }
  local_68 = ParserBase::peek(&stream->super_ParserBase);
  bVar2 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_68.kind);
  if (bVar2) {
    local_78._0_8_ = local_78._0_8_ & 0xffff;
    local_a8 = local_68;
    SVar4 = Token::location(&local_68);
    this->firstLocation = SVar4;
    iVar5 = 0;
    while( true ) {
      uVar3 = append(this,local_a8,iVar5 == 0);
      ParserBase::consume(&stream->super_ParserBase);
      if ((int)uVar3 < 0) {
        iVar5 = iVar5 + 1;
        local_a8 = ParserBase::peek(&stream->super_ParserBase);
      }
      else {
        Parser::handleExponentSplit(stream,local_a8,(ulong)uVar3);
        iVar5 = iVar5 + 2;
      }
      if (-1 < (int)uVar3) break;
      bVar2 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_a8.kind);
      if ((!bVar2) ||
         (sVar7 = Token::trivia(&local_a8), sVar7._M_extent._M_extent_value._M_extent_value != 0))
      break;
    }
    TVar1 = local_88;
    TVar6 = local_98;
    bVar2 = local_78._0_4_ == 0x23;
    local_78.kind = local_88.kind;
    local_78._2_1_ = local_88._2_1_;
    local_78.numFlags.raw = local_88.numFlags.raw;
    local_78.rawLen = local_88.rawLen;
    local_78.info = local_88.info;
    local_58.kind = local_98.kind;
    local_58._2_1_ = local_98._2_1_;
    local_58.numFlags.raw = local_98.numFlags.raw;
    local_58.rawLen = local_98.rawLen;
    local_58.info = local_98.info;
    local_98 = TVar6;
    local_88 = TVar1;
    TVar6 = finishValue(this,local_68,iVar5 == 1,bVar2);
    (__return_storage_ptr__->size).kind = local_78.kind;
    (__return_storage_ptr__->size).field_0x2 = local_78._2_1_;
    (__return_storage_ptr__->size).numFlags = (NumericTokenFlags)local_78.numFlags.raw;
    (__return_storage_ptr__->size).rawLen = local_78.rawLen;
    (__return_storage_ptr__->size).info = local_78.info;
    (__return_storage_ptr__->base).kind = local_58.kind;
    (__return_storage_ptr__->base).field_0x2 = local_58._2_1_;
    (__return_storage_ptr__->base).numFlags = (NumericTokenFlags)local_58.numFlags.raw;
    (__return_storage_ptr__->base).rawLen = local_58.rawLen;
    (__return_storage_ptr__->base).info = local_58.info;
    __return_storage_ptr__->value = TVar6;
    __return_storage_ptr__->isSimple = false;
  }
  else {
    reportMissingDigits(__return_storage_ptr__,this,local_88,local_98,local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        const bool isNegated = stream.getLastConsumed().kind == TokenKind::Minus;

        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                checkIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1, isNegated));
    }